

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::Matcher::
Matcher<std::__detail::_Node_iterator<char,true,false>,std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
          (Matcher *this,_Node_iterator<char,_true,_false> shortFlagsStart,
          _Node_iterator<char,_true,_false> shortFlagsEnd,
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          longFlagsStart,
          _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
          longFlagsEnd)

{
  runtime_error *this_00;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::
  _Hashtable<char,char,std::allocator<char>,std::__detail::_Identity,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_Hashtable<std::__detail::_Node_iterator<char,true,false>>();
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->longFlags,
             longFlagsStart.
             super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ._M_cur,longFlagsEnd.
                     super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     ._M_cur,0,local_50,&local_52,&local_51);
  if ((this->longFlags)._M_h._M_element_count != 0 || (this->shortFlags)._M_h._M_element_count != 0)
  {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"empty Matcher","");
  std::runtime_error::runtime_error(this_00,(string *)local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_0011c6c0;
  __cxa_throw(this_00,&UsageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matcher(ShortIt shortFlagsStart, ShortIt shortFlagsEnd, LongIt longFlagsStart, LongIt longFlagsEnd) :
                shortFlags(shortFlagsStart, shortFlagsEnd),
                longFlags(longFlagsStart, longFlagsEnd)
            {
                if (shortFlags.empty() && longFlags.empty())
                {
#ifndef ARGS_NOEXCEPT
                    throw UsageError("empty Matcher");
#endif
                }
            }